

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWGenerator::GetComponentPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  bool bVar1;
  cmCPackIFWPackage *pcVar2;
  bool local_1b9;
  string *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string_view local_138;
  string_view local_128;
  byte local_112;
  byte local_111;
  undefined1 local_110 [6];
  bool dot;
  cmCPackIFWPackage *local_f0;
  cmCPackIFWPackage *package_1;
  cmValue local_c8;
  cmValue option;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string prefix;
  cmCPackIFWPackage *package;
  undefined1 local_40 [8];
  string name;
  cmCPackComponent *component_local;
  cmCPackIFWGenerator *this_local;
  
  name.field_2._8_8_ = component;
  std::__cxx11::string::string((string *)local_40);
  if (name.field_2._8_8_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
    goto LAB_001ab529;
  }
  pcVar2 = GetComponentPackage(this,(cmCPackComponent *)name.field_2._8_8_);
  if (pcVar2 != (cmCPackIFWPackage *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pcVar2->Name);
    goto LAB_001ab529;
  }
  cmsys::SystemTools::UpperCase((string *)&option,(string *)name.field_2._8_8_);
  std::operator+(&local_a0,"CPACK_IFW_COMPONENT_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_a0,"_");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&option);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&package_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 "NAME");
  local_c8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&package_1);
  std::__cxx11::string::~string((string *)&package_1);
  bVar1 = cmValue::operator_cast_to_bool(&local_c8);
  if (bVar1) {
    local_1b0 = cmValue::operator*[abi_cxx11_(&local_c8);
  }
  else {
    local_1b0 = (string *)name.field_2._8_8_;
  }
  std::__cxx11::string::operator=((string *)local_40,(string *)local_1b0);
  if (*(long *)(name.field_2._8_8_ + 0x40) == 0) {
LAB_001ab4fc:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    local_f0 = GetGroupPackage(this,*(cmCPackComponentGroup **)(name.field_2._8_8_ + 0x40));
    local_111 = 0;
    local_1b9 = true;
    if ((this->super_cmCPackGenerator).componentPackageMethod != ONE_PACKAGE_PER_GROUP) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "COMMON");
      local_111 = 1;
      local_1b9 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_110);
    }
    if ((local_111 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_110);
    }
    if (local_1b9 == false) {
      local_112 = (this->ResolveDuplicateNames ^ 0xffU) & 1;
      if (local_112 != 0) {
        local_128 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
        local_138 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&local_f0->Name);
        bVar1 = cmHasPrefix(local_128,local_138);
        if (!bVar1) {
          std::operator+(&local_178,&local_f0->Name,".");
          std::operator+(&local_158,&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::__cxx11::string::operator=((string *)local_40,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_178);
        }
      }
      goto LAB_001ab4fc;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_f0->Name);
  }
  std::__cxx11::string::~string((string *)local_80);
LAB_001ab529:
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentPackageName(
  cmCPackComponent* component) const
{
  std::string name;
  if (!component) {
    return name;
  }
  if (cmCPackIFWPackage* package = this->GetComponentPackage(component)) {
    return package->Name;
  }
  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";
  cmValue option = this->GetOption(prefix + "NAME");
  name = option ? *option : component->Name;
  if (component->Group) {
    cmCPackIFWPackage* package = this->GetGroupPackage(component->Group);
    if ((this->componentPackageMethod ==
         cmCPackGenerator::ONE_PACKAGE_PER_GROUP) ||
        this->IsOn(prefix + "COMMON")) {
      return package->Name;
    }
    bool dot = !this->ResolveDuplicateNames;
    if (dot && !cmHasPrefix(name, package->Name)) {
      name = package->Name + "." + name;
    }
  }
  return name;
}